

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O2

void __thiscall
Encapsulation_encapsulationId_Test::Encapsulation_encapsulationId_Test
          (Encapsulation_encapsulationId_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_001247f0;
  return;
}

Assistant:

TEST(Encapsulation, encapsulationId)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    EXPECT_EQ("", model->encapsulationId());

    model->setEncapsulationId("my_id");
    EXPECT_EQ("my_id", model->encapsulationId());

    model->removeEncapsulationId();
    EXPECT_EQ("", model->encapsulationId());
}